

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O0

void __thiscall OpenMD::GofRAngle::processHistogram(GofRAngle *this)

{
  int iVar1;
  int iVar2;
  SnapshotManager *this_00;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  reference pvVar6;
  reference this_01;
  reference pvVar7;
  RadialDistrFunc *in_RDI;
  RealType RVar8;
  double dVar9;
  double dVar10;
  uint j;
  RealType nIdeal;
  RealType volSlice;
  RealType rUpper;
  RealType rLower;
  uint i;
  RealType pairConstant;
  RealType pairDensity;
  RealType volume;
  int nPairs;
  Snapshot *in_stack_ffffffffffffff90;
  uint local_54;
  uint local_2c;
  
  iVar2 = RadialDistrFunc::getNPairs(in_RDI);
  this_00 = SimInfo::getSnapshotManager((in_RDI->super_StaticAnalyser).info_);
  SnapshotManager::getCurrentSnapshot(this_00);
  RVar8 = Snapshot::getVolume(in_stack_ffffffffffffff90);
  local_2c = 0;
  while( true ) {
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&in_RDI[1].evaluator2_);
    if (sVar3 <= local_2c) break;
    dVar9 = (double)local_2c * *(double *)&in_RDI[1].super_StaticAnalyser.dumpFilename_.field_2;
    dVar10 = dVar9 + *(double *)&in_RDI[1].super_StaticAnalyser.dumpFilename_.field_2;
    local_54 = 0;
    while( true ) {
      uVar4 = (ulong)local_54;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&in_RDI[1].evaluator2_,(ulong)local_2c);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
      if (sVar3 <= uVar4) break;
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&in_RDI[1].evaluator2_,(ulong)local_2c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(ulong)local_54);
      iVar1 = *pvVar6;
      this_01 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)((long)&in_RDI[1].evaluator2_.compiler.filename.field_2 + 8),
                             (ulong)local_2c);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(ulong)local_54);
      *pvVar7 = (double)iVar1 /
                ((dVar10 * dVar10 * dVar10 + -(dVar9 * dVar9 * dVar9)) *
                ((((double)iVar2 / RVar8) * 12.566370614359172) / 3.0)) + *pvVar7;
      local_54 = local_54 + 1;
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void GofRAngle::processHistogram() {
    int nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType pairDensity  = nPairs / volume;
    RealType pairConstant = (4.0 * Constants::PI * pairDensity) / 3.0;

    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      RealType rLower = i * deltaR_;
      RealType rUpper = rLower + deltaR_;
      RealType volSlice =
          (rUpper * rUpper * rUpper) - (rLower * rLower * rLower);
      RealType nIdeal = volSlice * pairConstant;

      for (unsigned int j = 0; j < histogram_[i].size(); ++j) {
        avgGofr_[i][j] += histogram_[i][j] / nIdeal;
      }
    }
  }